

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void CorrectDCValues(VP8EncIterator *it,VP8Matrix *mtx,int16_t (*tmp) [16],VP8ModeScore *rd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int16_t *v;
  VP8Matrix *mtx_00;
  long in_RCX;
  long in_RDX;
  int *in_RDI;
  int err3;
  int err2;
  int err1;
  int err0;
  int16_t (*c) [16];
  int8_t *left;
  int8_t *top;
  int ch;
  int local_24;
  
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    pcVar4 = (char *)(*(long *)(in_RDI + 0x58) + (long)*in_RDI * 4 + (long)local_24 * 2);
    v = (int16_t *)((long)in_RDI + (long)local_24 * 2 + 0x158);
    mtx_00 = (VP8Matrix *)(in_RDX + (long)(local_24 << 2) * 0x20);
    mtx_00->q_[0] = mtx_00->q_[0] + (short)(*pcVar4 * 7 + (char)*v * 8 >> 3);
    iVar1 = QuantizeSingle(v,mtx_00);
    mtx_00->iq_[0] = mtx_00->iq_[0] + (short)(pcVar4[1] * 7 + iVar1 * 8 >> 3);
    iVar2 = QuantizeSingle(v,mtx_00);
    *(short *)mtx_00->bias_ =
         (short)mtx_00->bias_[0] + (short)(iVar1 * 7 + *(char *)((long)v + 1) * 8 >> 3);
    iVar1 = QuantizeSingle(v,mtx_00);
    *(short *)(mtx_00->bias_ + 8) = (short)mtx_00->bias_[8] + (short)(iVar2 * 7 + iVar1 * 8 >> 3);
    iVar3 = QuantizeSingle(v,mtx_00);
    *(char *)(in_RCX + 0x364 + (long)local_24 * 3) = (char)iVar2;
    *(char *)(in_RCX + (long)local_24 * 3 + 0x365) = (char)iVar1;
    *(char *)(in_RCX + (long)local_24 * 3 + 0x366) = (char)iVar3;
  }
  return;
}

Assistant:

static void CorrectDCValues(const VP8EncIterator* const it,
                            const VP8Matrix* const mtx,
                            int16_t tmp[][16], VP8ModeScore* const rd) {
  //         | top[0] | top[1]
  // --------+--------+---------
  // left[0] | tmp[0]   tmp[1]  <->   err0 err1
  // left[1] | tmp[2]   tmp[3]        err2 err3
  //
  // Final errors {err1,err2,err3} are preserved and later restored
  // as top[]/left[] on the next block.
  int ch;
  for (ch = 0; ch <= 1; ++ch) {
    const int8_t* const top = it->top_derr_[it->x_][ch];
    const int8_t* const left = it->left_derr_[ch];
    int16_t (* const c)[16] = &tmp[ch * 4];
    int err0, err1, err2, err3;
    c[0][0] += (C1 * top[0] + C2 * left[0]) >> (DSHIFT - DSCALE);
    err0 = QuantizeSingle(&c[0][0], mtx);
    c[1][0] += (C1 * top[1] + C2 * err0) >> (DSHIFT - DSCALE);
    err1 = QuantizeSingle(&c[1][0], mtx);
    c[2][0] += (C1 * err0 + C2 * left[1]) >> (DSHIFT - DSCALE);
    err2 = QuantizeSingle(&c[2][0], mtx);
    c[3][0] += (C1 * err1 + C2 * err2) >> (DSHIFT - DSCALE);
    err3 = QuantizeSingle(&c[3][0], mtx);
    // error 'err' is bounded by mtx->q_[0] which is 132 at max. Hence
    // err >> DSCALE will fit in an int8_t type if DSCALE>=1.
    assert(abs(err1) <= 127 && abs(err2) <= 127 && abs(err3) <= 127);
    rd->derr[ch][0] = (int8_t)err1;
    rd->derr[ch][1] = (int8_t)err2;
    rd->derr[ch][2] = (int8_t)err3;
  }
}